

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssertionPortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1)

{
  AssertionPortSymbol *pAVar1;
  BumpAllocator *in_RDX;
  AssertionPortSymbol *in_RDI;
  SourceLocation unaff_retaddr;
  string_view in_stack_00000008;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pAVar1 = (AssertionPortSymbol *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::ast::AssertionPortSymbol::AssertionPortSymbol(in_RDI,in_stack_00000008,unaff_retaddr);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }